

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O1

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::Triplet::handle
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,Triplet *this,
          Vector3d *position)

{
  double dVar1;
  double *pdVar2;
  Index size;
  Vector3d *pVVar3;
  undefined8 *puVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  VectorXd pv;
  scalar_sum_op<double,_double> local_49;
  DenseStorage<double,__1,__1,_1,_0> local_48;
  double *local_38;
  Matrix3d *local_30;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_28;
  
  local_48.m_rows = (Index)&this->_basis;
  local_48.m_data = (double *)position;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_38,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)&local_48);
  if ((long)local_30 < 1) {
LAB_001436ac:
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  if (-1e-11 <= *local_38) {
    if (local_30 == (Matrix3d *)0x1) goto LAB_001436ac;
    if (-1e-11 <= local_38[1]) {
      if ((long)local_30 < 3) goto LAB_001436ac;
      if (-1e-11 <= local_38[2]) {
        local_48.m_rows = (Index)local_38;
        local_28.m_xpr = (XprTypeNested)&local_38;
        auVar9._0_8_ = Eigen::internal::
                       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
                       ::
                       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   *)&local_48,&local_49,&local_28);
        pdVar2 = local_38;
        if ((long)local_30 < 0) {
LAB_001436cb:
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                        ,0x4a,
                        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                       );
        }
        auVar9._8_8_ = 0;
        auVar9 = sqrtpd(auVar9,auVar9);
        puVar5 = (undefined1 *)((ulong)local_30 & 0x7ffffffffffffffe);
        dVar8 = auVar9._0_8_;
        if (1 < (long)local_30) {
          auVar10._8_8_ = dVar8;
          auVar10._0_8_ = dVar8;
          puVar6 = (undefined1 *)0x0;
          do {
            auVar9 = divpd(*(undefined1 (*) [16])(local_38 + (long)puVar6),auVar10);
            *(undefined1 (*) [16])(local_38 + (long)puVar6) = auVar9;
            puVar6 = puVar6 + 2;
          } while (puVar6 < puVar5);
        }
        if ((long)puVar5 < (long)local_30) {
          do {
            local_38[(long)puVar5] = local_38[(long)puVar5] / dVar8;
            puVar5 = puVar5 + 1;
          } while (local_30 != (Matrix3d *)puVar5);
        }
        if ((long)local_30 < 0) goto LAB_001436cb;
        local_48.m_data = (double *)0x0;
        local_48.m_rows = 0;
        if (local_30 != (Matrix3d *)0x0) {
          free((void *)0x0);
          if (local_30 == (Matrix3d *)0x0) {
            pVVar3 = (Vector3d *)0x0;
          }
          else {
            if ((ulong)local_30 >> 0x3d != 0) {
LAB_001435cf:
              puVar4 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar4 = std::random_device::_M_fini;
              __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            pVVar3 = (Vector3d *)malloc((long)local_30 * 8);
            if (local_30 != (Matrix3d *)0x1 && ((ulong)pVVar3 & 0xf) != 0) {
              __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/Memory.h"
                            ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
            }
            if (pVVar3 == (Vector3d *)0x0) goto LAB_001435cf;
          }
          local_48.m_rows = (Index)local_30;
          local_48.m_data = (double *)pVVar3;
        }
        auVar9 = _DAT_001a9780;
        if ((Matrix3d *)local_48.m_rows != local_30) {
          __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/AssignEvaluator.h"
                        ,0x2fd,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_min_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_max_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
                       );
        }
        puVar5 = (undefined1 *)(local_48.m_rows - (local_48.m_rows >> 0x3f) & 0xfffffffffffffffe);
        if (1 < local_48.m_rows) {
          lVar7 = 0;
          do {
            auVar10 = maxpd(ZEXT816(0),*(undefined1 (*) [16])(pdVar2 + lVar7));
            auVar10 = minpd(auVar9,auVar10);
            *(undefined1 (*) [16])
             ((((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_48.m_data)->
              m_storage).m_data.array + lVar7) = auVar10;
            lVar7 = lVar7 + 2;
          } while (lVar7 < (long)puVar5);
        }
        if ((long)puVar5 < local_48.m_rows) {
          do {
            dVar8 = pdVar2[(long)puVar5];
            dVar1 = 0.0;
            if (0.0 <= dVar8) {
              dVar1 = dVar8;
            }
            dVar8 = 1.0;
            if (dVar1 <= 1.0) {
              dVar8 = dVar1;
            }
            (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_48.m_data)->m_storage)
            .m_data.array[(long)puVar5] = dVar8;
            puVar5 = puVar5 + 1;
          } while ((undefined1 *)local_48.m_rows != puVar5);
        }
        (__return_storage_ptr__->super_type).m_initialized = false;
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                  ((DenseStorage<double,__1,__1,_1,_0> *)
                   &(__return_storage_ptr__->super_type).m_storage,&local_48);
        (__return_storage_ptr__->super_type).m_initialized = true;
        free(local_48.m_data);
        goto LAB_001434d1;
      }
    }
  }
  (__return_storage_ptr__->super_type).m_initialized = false;
LAB_001434d1:
  free(local_38);
  return __return_storage_ptr__;
}

Assistant:

boost::optional<Eigen::VectorXd> Triplet::handle(
      Eigen::Vector3d position) const {
    Eigen::VectorXd pv = position.transpose() * _basis;
    double epsilon = -1e-11;
    if (pv(0) >= epsilon && pv(1) >= epsilon && pv(2) >= epsilon) {
      pv /= pv.norm();
      return pv.cwiseMax(0.0).cwiseMin(1.0).eval();
    }
    return boost::none;
  }